

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qeventpoint.cpp
# Opt level: O1

void QEventPoint::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  double *pdVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  
  if (_c == WriteProperty) {
    if (_id != 0) {
      return;
    }
    if (*(long *)_o == 0) {
      return;
    }
    *(undefined1 *)(*(long *)_o + 0xdd) = **_a;
    return;
  }
  if (_c != ReadProperty) {
    return;
  }
  if (0x18 < (uint)_id) {
    return;
  }
  pdVar1 = (double *)*_a;
  switch(_id) {
  case 0:
    if (*(long *)_o != 0) {
      uVar2 = *(undefined1 *)(*(long *)_o + 0xdd);
      goto LAB_002c2037;
    }
    goto LAB_002c2034;
  case 1:
    if (*(long *)_o != 0) {
      dVar6 = *(double *)(*(long *)_o + 8);
      goto LAB_002c1f3c;
    }
    goto LAB_002c1f39;
  case 2:
    if (*(long *)_o == 0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = *(undefined4 *)(*(long *)_o + 0xd8);
    }
    *(undefined4 *)pdVar1 = uVar3;
    return;
  case 3:
    if (*(long *)_o == 0) {
      dVar6 = -NAN;
    }
    else {
      dVar6 = *(double *)(*(long *)_o + 0xd0);
    }
    goto LAB_002c1f3c;
  case 4:
    if (*(long *)_o != 0) {
      uVar2 = *(undefined1 *)(*(long *)_o + 0xdc);
      goto LAB_002c2037;
    }
LAB_002c2034:
    uVar2 = 0;
LAB_002c2037:
    *(undefined1 *)pdVar1 = uVar2;
    return;
  case 5:
    if (*(long *)_o != 0) {
      dVar6 = *(double *)(*(long *)_o + 0xb8);
      goto LAB_002c1f3c;
    }
    goto LAB_002c1f39;
  case 6:
    if (*(long *)_o != 0) {
      dVar6 = *(double *)(*(long *)_o + 200);
      goto LAB_002c1f3c;
    }
    goto LAB_002c1f39;
  case 7:
    if (*(long *)_o != 0) {
      dVar6 = *(double *)(*(long *)_o + 0xc0);
      goto LAB_002c1f3c;
    }
LAB_002c1f39:
    dVar6 = 0.0;
LAB_002c1f3c:
    *pdVar1 = dVar6;
    return;
  case 8:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      lVar4 = *(long *)(lVar4 + 0xb8) - *(long *)(lVar4 + 200);
      auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = 0x45300000;
      dVar6 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000.0;
      goto LAB_002c1fbf;
    }
    goto LAB_002c1fbb;
  case 9:
    if (*(long *)_o != 0) {
      dVar6 = *(double *)(*(long *)_o + 0x90);
      goto LAB_002c1fbf;
    }
    goto LAB_002c1fbb;
  case 10:
    if (*(long *)_o != 0) {
      dVar6 = *(double *)(*(long *)_o + 0x98);
      goto LAB_002c1fbf;
    }
LAB_002c1fbb:
    dVar6 = 0.0;
LAB_002c1fbf:
    *pdVar1 = dVar6;
    return;
  case 0xb:
    lVar4 = *(long *)_o;
    if (lVar4 == 0) {
      dVar6 = -1.0;
      dVar8 = -1.0;
    }
    else {
      dVar6 = *(double *)(lVar4 + 0xa0);
      dVar8 = *(double *)(lVar4 + 0xa8);
    }
    goto LAB_002c200d;
  case 0xc:
    if (*(long *)_o == 0) {
      dVar6 = 0.0;
    }
    else {
      dVar6 = *(double *)(*(long *)_o + 0xb0);
    }
    *pdVar1 = dVar6;
    return;
  case 0xd:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x30);
      dVar8 = *(double *)(lVar4 + 0x38);
      goto LAB_002c200d;
    }
    break;
  case 0xe:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x30);
      dVar8 = *(double *)(lVar4 + 0x38);
LAB_002c1f56:
      dVar10 = *(double *)(lVar4 + 0x50);
      dVar11 = *(double *)(lVar4 + 0x58);
      dVar5 = *(double *)(lVar4 + 0x60);
      dVar7 = *(double *)(lVar4 + 0x68);
LAB_002c1fef:
      dVar6 = (dVar5 - dVar10) + dVar6;
      dVar8 = (dVar7 - dVar11) + dVar8;
      goto LAB_002c200d;
    }
    break;
  case 0xf:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x30);
      dVar8 = *(double *)(lVar4 + 0x38);
LAB_002c1fe3:
      dVar10 = *(double *)(lVar4 + 0x50);
      dVar11 = *(double *)(lVar4 + 0x58);
      dVar5 = *(double *)(lVar4 + 0x70);
      dVar7 = *(double *)(lVar4 + 0x78);
      goto LAB_002c1fef;
    }
    break;
  case 0x10:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x30);
      dVar8 = *(double *)(lVar4 + 0x38);
LAB_002c1ed5:
      dVar10 = *(double *)(lVar4 + 0x50);
      dVar11 = *(double *)(lVar4 + 0x58);
      dVar5 = *(double *)(lVar4 + 0x80);
      dVar7 = *(double *)(lVar4 + 0x88);
      goto LAB_002c1fef;
    }
    break;
  case 0x11:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x40);
      dVar8 = *(double *)(lVar4 + 0x48);
      goto LAB_002c200d;
    }
    break;
  case 0x12:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x40);
      dVar8 = *(double *)(lVar4 + 0x48);
      goto LAB_002c1f56;
    }
    break;
  case 0x13:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x40);
      dVar8 = *(double *)(lVar4 + 0x48);
      goto LAB_002c1fe3;
    }
    break;
  case 0x14:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x40);
      dVar8 = *(double *)(lVar4 + 0x48);
      goto LAB_002c1ed5;
    }
    break;
  case 0x15:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x50);
      dVar8 = *(double *)(lVar4 + 0x58);
      goto LAB_002c200d;
    }
    break;
  case 0x16:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x60);
      dVar8 = *(double *)(lVar4 + 0x68);
      goto LAB_002c200d;
    }
    break;
  case 0x17:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x70);
      dVar8 = *(double *)(lVar4 + 0x78);
      goto LAB_002c200d;
    }
    break;
  case 0x18:
    lVar4 = *(long *)_o;
    if (lVar4 != 0) {
      dVar6 = *(double *)(lVar4 + 0x80);
      dVar8 = *(double *)(lVar4 + 0x88);
      goto LAB_002c200d;
    }
  }
  dVar6 = 0.0;
  dVar8 = 0.0;
LAB_002c200d:
  *pdVar1 = dVar6;
  pdVar1[1] = dVar8;
  return;
}

Assistant:

void QEventPoint::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QEventPoint *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isAccepted(); break;
        case 1: *reinterpret_cast<const QPointingDevice**>(_v) = _t->device(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->id(); break;
        case 3: *reinterpret_cast<QPointingDeviceUniqueId*>(_v) = _t->uniqueId(); break;
        case 4: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 5: *reinterpret_cast<ulong*>(_v) = _t->timestamp(); break;
        case 6: *reinterpret_cast<ulong*>(_v) = _t->pressTimestamp(); break;
        case 7: *reinterpret_cast<ulong*>(_v) = _t->lastTimestamp(); break;
        case 8: *reinterpret_cast<qreal*>(_v) = _t->timeHeld(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->pressure(); break;
        case 10: *reinterpret_cast<qreal*>(_v) = _t->rotation(); break;
        case 11: *reinterpret_cast<QSizeF*>(_v) = _t->ellipseDiameters(); break;
        case 12: *reinterpret_cast<QVector2D*>(_v) = _t->velocity(); break;
        case 13: *reinterpret_cast<QPointF*>(_v) = _t->position(); break;
        case 14: *reinterpret_cast<QPointF*>(_v) = _t->pressPosition(); break;
        case 15: *reinterpret_cast<QPointF*>(_v) = _t->grabPosition(); break;
        case 16: *reinterpret_cast<QPointF*>(_v) = _t->lastPosition(); break;
        case 17: *reinterpret_cast<QPointF*>(_v) = _t->scenePosition(); break;
        case 18: *reinterpret_cast<QPointF*>(_v) = _t->scenePressPosition(); break;
        case 19: *reinterpret_cast<QPointF*>(_v) = _t->sceneGrabPosition(); break;
        case 20: *reinterpret_cast<QPointF*>(_v) = _t->sceneLastPosition(); break;
        case 21: *reinterpret_cast<QPointF*>(_v) = _t->globalPosition(); break;
        case 22: *reinterpret_cast<QPointF*>(_v) = _t->globalPressPosition(); break;
        case 23: *reinterpret_cast<QPointF*>(_v) = _t->globalGrabPosition(); break;
        case 24: *reinterpret_cast<QPointF*>(_v) = _t->globalLastPosition(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAccepted(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}